

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_nearest_apply_interpolation_p8
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m256 _v;
  int i;
  int *offset_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outd;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  int local_400;
  int *local_3a8;
  undefined1 (*local_358) [32];
  int local_300;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  lVar9 = in_RSI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar10 = in_RSI[6];
  iVar2 = *(int *)((long)in_RSI + 0x34);
  for (local_300 = 0; local_300 < (int)lVar9; local_300 = local_300 + 1) {
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    local_358 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_300 * in_RSI[2]);
    local_3a8 = (int *)*in_RDX;
    for (local_400 = 0; local_400 < iVar1 * (int)lVar10 * iVar2; local_400 = local_400 + 1) {
      if (*local_3a8 < 0) {
        auVar6 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0),0x30);
        auVar7 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(0),0x30);
        local_80 = auVar7._0_8_;
        uStack_78 = auVar7._8_8_;
        uStack_70 = auVar6._0_8_;
        uStack_68 = auVar6._8_8_;
        local_4c0 = local_80;
        uStack_4b8 = uStack_78;
        uStack_4b0 = uStack_70;
        uStack_4a8 = uStack_68;
      }
      else {
        puVar11 = (undefined8 *)(lVar3 + lVar4 * local_300 * lVar5 + (long)*local_3a8 * 4);
        local_4c0 = *puVar11;
        uStack_4b8 = puVar11[1];
        uStack_4b0 = puVar11[2];
        uStack_4a8 = puVar11[3];
      }
      local_3a8 = local_3a8 + 1;
      auVar8._8_8_ = uStack_4b8;
      auVar8._0_8_ = local_4c0;
      auVar8._16_8_ = uStack_4b0;
      auVar8._24_8_ = uStack_4a8;
      *local_358 = auVar8;
      local_358 = local_358 + 1;
    }
  }
  return;
}

Assistant:

static void gridsample_nearest_apply_interpolation_p8(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const int* offset_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m256 _v = offset_ptr[0] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[0]) : _mm256_set1_ps(0);
            offset_ptr++;

            _mm256_storeu_ps(dstptr, _v);
            dstptr += 8;
        }
    }
}